

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::CheckBinding
          (ShaderImageLoadStoreBase *this,GLuint unit,GLuint texture,GLint level,GLboolean layered,
          GLint layer,GLenum access,GLenum format)

{
  ulong uVar1;
  ulong uVar2;
  char *format_00;
  CallLogWrapper *this_00;
  GLboolean b;
  byte local_39;
  uint local_38;
  uint local_34;
  
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  local_34 = layer;
  glu::CallLogWrapper::glGetIntegeri_v(this_00,0x8f3a,unit,(GLint *)&local_38);
  uVar2 = (ulong)local_38;
  if (local_38 == texture) {
    glu::CallLogWrapper::glGetBooleani_v(this_00,0x8f3a,unit,&local_39);
    uVar2 = (ulong)local_39;
    uVar1 = (ulong)(local_38 != 0);
    if ((bool)local_39 == (local_38 != 0)) {
      glu::CallLogWrapper::glGetIntegeri_v(this_00,0x8f3b,unit,(GLint *)&local_38);
      uVar2 = (ulong)local_38;
      if (local_38 == level) {
        glu::CallLogWrapper::glGetBooleani_v(this_00,0x8f3b,unit,&local_39);
        uVar2 = (ulong)local_39;
        uVar1 = (ulong)(local_38 != 0);
        if ((bool)local_39 == (local_38 != 0)) {
          glu::CallLogWrapper::glGetIntegeri_v(this_00,0x8f3c,unit,(GLint *)&local_38);
          uVar2 = (ulong)local_38;
          uVar1 = (ulong)(uint)layered;
          if (local_38 == layered) {
            glu::CallLogWrapper::glGetBooleani_v(this_00,0x8f3c,unit,&local_39);
            uVar2 = (ulong)local_39;
            uVar1 = (ulong)(local_38 != 0);
            if ((bool)local_39 == (local_38 != 0)) {
              glu::CallLogWrapper::glGetIntegeri_v(this_00,0x8f3d,unit,(GLint *)&local_38);
              uVar2 = (ulong)local_38;
              uVar1 = (ulong)local_34;
              if (local_38 == local_34) {
                glu::CallLogWrapper::glGetBooleani_v(this_00,0x8f3d,unit,&local_39);
                uVar2 = (ulong)local_39;
                uVar1 = (ulong)(local_38 != 0);
                if ((bool)local_39 == (local_38 != 0)) {
                  glu::CallLogWrapper::glGetIntegeri_v(this_00,0x8f3e,unit,(GLint *)&local_38);
                  if (local_38 == access) {
                    glu::CallLogWrapper::glGetBooleani_v(this_00,0x8f3e,unit,&local_39);
                    uVar2 = (ulong)local_39;
                    uVar1 = (ulong)(local_38 != 0);
                    if ((bool)local_39 != (local_38 != 0)) {
                      format_00 = "GL_IMAGE_BINDING_ACCESS (as boolean) is %d should be %d.\n";
                      goto LAB_009974e7;
                    }
                    glu::CallLogWrapper::glGetIntegeri_v(this_00,0x906e,unit,(GLint *)&local_38);
                    if (local_38 == format) {
                      glu::CallLogWrapper::glGetBooleani_v(this_00,0x906e,unit,&local_39);
                      uVar2 = (ulong)local_39;
                      uVar1 = (ulong)(local_38 != 0);
                      if ((bool)local_39 == (local_38 != 0)) {
                        return true;
                      }
                      format_00 = "GL_IMAGE_BINDING_FORMAT (as boolean) is %d should be %d.\n";
                      goto LAB_009974e7;
                    }
                    format_00 = "GL_IMAGE_BINDING_FORMAT is %d should be %d.\n";
                  }
                  else {
                    format_00 = "GL_IMAGE_BINDING_ACCESS is %d should be %d.\n";
                    format = access;
                  }
                  uVar2 = (ulong)local_38;
                  uVar1 = (ulong)format;
                }
                else {
                  format_00 = "GL_IMAGE_BINDING_LAYER (as boolean) is %d should be %d.\n";
                }
              }
              else {
                format_00 = "GL_IMAGE_BINDING_LAYER is %d should be %d.\n";
              }
            }
            else {
              format_00 = "GL_IMAGE_BINDING_LAYERED (as boolean) is %d should be %d.\n";
            }
          }
          else {
            format_00 = "GL_IMAGE_BINDING_LAYERED is %d should be %d.\n";
          }
        }
        else {
          format_00 = "GL_IMAGE_BINDING_LEVEL (as boolean) is %d should be %d.\n";
        }
      }
      else {
        format_00 = "GL_IMAGE_BINDING_LEVEL is %d should be %d.\n";
        uVar1 = (ulong)(uint)level;
      }
    }
    else {
      format_00 = "GL_IMAGE_BINDING_NAME (as boolean) is %d should be %d.\n";
    }
  }
  else {
    format_00 = "GL_IMAGE_BINDING_NAME is %d should be %d.\n";
    uVar1 = (ulong)texture;
  }
LAB_009974e7:
  anon_unknown_0::Output(format_00,uVar2,uVar1);
  return false;
}

Assistant:

bool CheckBinding(GLuint unit, GLuint texture, GLint level, GLboolean layered, GLint layer, GLenum access,
					  GLenum format)
	{
		GLint	 i;
		GLboolean b;

		glGetIntegeri_v(GL_IMAGE_BINDING_NAME, unit, &i);
		if (static_cast<GLuint>(i) != texture)
		{
			Output("GL_IMAGE_BINDING_NAME is %d should be %d.\n", i, texture);
			return false;
		}
		glGetBooleani_v(GL_IMAGE_BINDING_NAME, unit, &b);
		if (b != (i ? GL_TRUE : GL_FALSE))
		{
			Output("GL_IMAGE_BINDING_NAME (as boolean) is %d should be %d.\n", b, (i ? GL_TRUE : GL_FALSE));
			return false;
		}

		glGetIntegeri_v(GL_IMAGE_BINDING_LEVEL, unit, &i);
		if (i != level)
		{
			Output("GL_IMAGE_BINDING_LEVEL is %d should be %d.\n", i, level);
			return false;
		}
		glGetBooleani_v(GL_IMAGE_BINDING_LEVEL, unit, &b);
		if (b != (i ? GL_TRUE : GL_FALSE))
		{
			Output("GL_IMAGE_BINDING_LEVEL (as boolean) is %d should be %d.\n", b, (i ? GL_TRUE : GL_FALSE));
			return false;
		}

		glGetIntegeri_v(GL_IMAGE_BINDING_LAYERED, unit, &i);
		if (i != layered)
		{
			Output("GL_IMAGE_BINDING_LAYERED is %d should be %d.\n", i, layered);
			return false;
		}
		glGetBooleani_v(GL_IMAGE_BINDING_LAYERED, unit, &b);
		if (b != (i ? GL_TRUE : GL_FALSE))
		{
			Output("GL_IMAGE_BINDING_LAYERED (as boolean) is %d should be %d.\n", b, (i ? GL_TRUE : GL_FALSE));
			return false;
		}

		glGetIntegeri_v(GL_IMAGE_BINDING_LAYER, unit, &i);
		if (i != layer)
		{
			Output("GL_IMAGE_BINDING_LAYER is %d should be %d.\n", i, layer);
			return false;
		}
		glGetBooleani_v(GL_IMAGE_BINDING_LAYER, unit, &b);
		if (b != (i ? GL_TRUE : GL_FALSE))
		{
			Output("GL_IMAGE_BINDING_LAYER (as boolean) is %d should be %d.\n", b, (i ? GL_TRUE : GL_FALSE));
			return false;
		}

		glGetIntegeri_v(GL_IMAGE_BINDING_ACCESS, unit, &i);
		if (static_cast<GLenum>(i) != access)
		{
			Output("GL_IMAGE_BINDING_ACCESS is %d should be %d.\n", i, access);
			return false;
		}
		glGetBooleani_v(GL_IMAGE_BINDING_ACCESS, unit, &b);
		if (b != (i ? GL_TRUE : GL_FALSE))
		{
			Output("GL_IMAGE_BINDING_ACCESS (as boolean) is %d should be %d.\n", b, (i ? GL_TRUE : GL_FALSE));
			return false;
		}

		glGetIntegeri_v(GL_IMAGE_BINDING_FORMAT, unit, &i);
		if (static_cast<GLenum>(i) != format)
		{
			Output("GL_IMAGE_BINDING_FORMAT is %d should be %d.\n", i, format);
			return false;
		}
		glGetBooleani_v(GL_IMAGE_BINDING_FORMAT, unit, &b);
		if (b != (i ? GL_TRUE : GL_FALSE))
		{
			Output("GL_IMAGE_BINDING_FORMAT (as boolean) is %d should be %d.\n", b, (i ? GL_TRUE : GL_FALSE));
			return false;
		}

		return true;
	}